

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::ArchiveIN
          (ChLinkRevoluteTranslational *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_a8;
  ChNameValue<chrono::ChVector<double>_> local_90;
  ChNameValue<chrono::ChVector<double>_> local_78;
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkRevoluteTranslational>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_30._value = &this->m_p1;
  local_30._name = "m_p1";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->m_p2;
  local_48._name = "m_p2";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->m_z1;
  local_60._name = "m_z1";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->m_x2;
  local_78._name = "m_x2";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->m_y2;
  local_90._name = "m_y2";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->m_dist;
  local_a8._name = "m_dist";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  return;
}

Assistant:

void ChLinkRevoluteTranslational::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkRevoluteTranslational>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(m_p1);
    marchive >> CHNVP(m_p2);
    marchive >> CHNVP(m_z1);
    marchive >> CHNVP(m_x2);
    marchive >> CHNVP(m_y2);
    marchive >> CHNVP(m_dist);
}